

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall FunctionDefinition::Action(FunctionDefinition *this)

{
  SymbolTableTree *this_00;
  LogTools *pLVar1;
  bool bVar2;
  compile_errcode cVar3;
  undefined1 local_218 [8];
  string previous_table_name_2;
  int space_length;
  SymbolTableTerm term;
  string previous_table_name_1;
  undefined1 local_190 [8];
  string previous_table_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  allocator local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_60;
  int local_5c;
  int local_58;
  int character_number;
  int line_number;
  SymbolName local_44;
  undefined1 local_40 [4];
  SymbolName name;
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  int local_20;
  int return_value_number;
  int state;
  int ret;
  FunctionDefinition *this_local;
  
  local_20 = 0;
  argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<_SymbolType,_std::allocator<_SymbolType>_>::vector
            ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_40);
  do {
    local_44 = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_58 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_5c = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(local_20) {
    case 0:
      bVar2 = IsValidFunctionType(local_44);
      if (!bVar2) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      local_20 = 1;
      this->m_type = local_44;
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_ = IsValidVariableType(local_44);
      argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      break;
    case 1:
      if (local_44 != IDENTIFIER_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_80,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      bVar2 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,false);
      if (bVar2) {
        this->m_valid = false;
        pLVar1 = g_log_tools;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,"repeat definition identifier(func)",&local_a1);
        LogTools::SemanticErrorLogs(pLVar1,&local_a0,&this->m_identifier_name,local_58,local_5c);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        std::operator+(&local_e8,"error_",&this->m_identifier_name);
        std::operator+(&local_c8,&local_e8,"_error");
        std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      else {
        bVar2 = SymbolTableTree::MatchKeyword(symbol_table_tree,&this->m_identifier_name);
        if (bVar2) {
          this->m_valid = false;
          pLVar1 = g_log_tools;
          std::operator+(&local_108,"identifier repeat with the keyword: ",&this->m_identifier_name)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_128,"",&local_129);
          LogTools::SemanticErrorLogs(pLVar1,&local_108,&local_128,local_58,local_5c);
          std::__cxx11::string::~string((string *)&local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
          std::__cxx11::string::~string((string *)&local_108);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&previous_table_name.field_2 + 8),"error_",&this->m_identifier_name)
          ;
          std::operator+(&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&previous_table_name.field_2 + 8),"_error");
          std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)(previous_table_name.field_2._M_local_buf + 8));
        }
        else {
          this->m_valid = true;
        }
      }
      SymbolTableTree::GetCurrentTableName_abi_cxx11_((string *)local_190,symbol_table_tree);
      this_00 = symbol_table_tree;
      previous_table_name_1.field_2._12_4_ = Name2Type(this->m_type);
      SymbolTableTree::InsertTable
                (this_00,&this->m_identifier_name,
                 (SymbolType *)(previous_table_name_1.field_2._M_local_buf + 0xc),
                 (string *)local_190);
      SymbolTableTree::SetCurrentTableName(symbol_table_tree,&this->m_identifier_name);
      local_20 = 2;
      local_60 = 4;
      std::__cxx11::string::~string((string *)local_190);
      break;
    case 2:
      if (local_44 != L_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      local_20 = 3;
      break;
    case 3:
      cVar3 = ArgumentList::Action
                        (&this->m_argument_list,
                         (vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_40);
      if (cVar3 != 0) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      ArgumentList::LogOutput(&this->m_argument_list);
      SymbolTableTree::GetCurrentPreviousTableName_abi_cxx11_
                ((string *)&term.m_other_information,symbol_table_tree);
      SymbolTableTree::SetCurrentTableName(symbol_table_tree,(string *)&term.m_other_information);
      previous_table_name_2.field_2._12_4_ = 3;
      SymbolTableTerm::SymbolTableTerm
                ((SymbolTableTerm *)&space_length,&this->m_identifier_name,
                 (SymbolKind *)(previous_table_name_2.field_2._M_local_buf + 0xc),&this->m_type);
      SymbolTableTerm::SetFuncInformation((SymbolTableTerm *)&space_length,this->m_argument_number);
      SymbolTableTree::Insert(symbol_table_tree,(SymbolTableTerm *)&space_length);
      SymbolTableTree::SetCurrentTableName(symbol_table_tree,&this->m_identifier_name);
      local_20 = 4;
      local_60 = 4;
      SymbolTableTerm::~SymbolTableTerm((SymbolTableTerm *)&space_length);
      std::__cxx11::string::~string((string *)&term.m_other_information.char_value);
      break;
    case 4:
      if (local_44 != R_CIRCLE_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      local_20 = 5;
      break;
    case 5:
      if (local_44 != L_CURLY_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      local_20 = 6;
      break;
    case 6:
      cVar3 = CompoundStatement::Action(&this->m_compound_statement);
      if (cVar3 != 0) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      CompoundStatement::LogOutput(&this->m_compound_statement);
      local_20 = 7;
      break;
    case 7:
      if (local_44 != R_CURLY_BRACKET_SYM) {
        this_local._4_4_ = -1;
        goto LAB_001965a5;
      }
      previous_table_name_2.field_2._8_4_ = 0;
      SymbolTableTree::GetTableSpaceLength
                (symbol_table_tree,&this->m_identifier_name,
                 (int *)(previous_table_name_2.field_2._M_local_buf + 8));
      FunctionTable::InsertTerm
                (handle_func_table,&this->m_identifier_name,previous_table_name_2.field_2._8_4_,
                 argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._4_4_,
                 (vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_40);
      SymbolTableTree::UpgradeAddress(symbol_table_tree);
      SymbolTableTree::GetCurrentPreviousTableName_abi_cxx11_((string *)local_218,symbol_table_tree)
      ;
      SymbolTableTree::SetCurrentTableName(symbol_table_tree,(string *)local_218);
      local_20 = 8;
      local_60 = 4;
      std::__cxx11::string::~string((string *)local_218);
      break;
    case 8:
      this_local._4_4_ = 0;
LAB_001965a5:
      local_60 = 1;
      std::vector<_SymbolType,_std::allocator<_SymbolType>_>::~vector
                ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_40);
      return this_local._4_4_;
    }
    if ((local_20 != 4) && (local_20 != 7)) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode FunctionDefinition::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    int return_value_number = 0;
    vector<SymbolType> argument_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (IsValidFunctionType(name)) {
                    state = 1;
                    m_type = name;
                    if (IsValidVariableType(name)) {
                        return_value_number = 1;        
                    } else {
                        return_value_number = 0;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, false)) {
                        m_valid = false;
                        g_log_tools->SemanticErrorLogs(string("repeat definition identifier(func)"), m_identifier_name, line_number, character_number);
                        m_identifier_name = "error_" + m_identifier_name + "_error";
                    } else {
                        if (symbol_table_tree->MatchKeyword(m_identifier_name)) {
                            m_valid = false;
                            g_log_tools->SemanticErrorLogs("identifier repeat with the keyword: " + m_identifier_name, "", line_number, character_number);
                            m_identifier_name = "error_" + m_identifier_name + "_error";
                        } else {
                            m_valid = true;
                        }
                    }
                    string previous_table_name = symbol_table_tree->GetCurrentTableName();
                    symbol_table_tree->InsertTable(m_identifier_name, Name2Type(m_type), previous_table_name);
                    symbol_table_tree->SetCurrentTableName(m_identifier_name);
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if ((ret = m_argument_list.Action(argument_type)) == COMPILE_OK) {
                    m_argument_list.LogOutput();
                    string previous_table_name = symbol_table_tree->GetCurrentPreviousTableName();
                    symbol_table_tree->SetCurrentTableName(previous_table_name);
                    SymbolTableTerm term(m_identifier_name, FUNCTION, m_type);
                    term.SetFuncInformation(m_argument_number);
                    symbol_table_tree->Insert(term);
                    symbol_table_tree->SetCurrentTableName(m_identifier_name);
                    state = 4;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == L_CURLY_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: {
                if ((ret = m_compound_statement.Action()) == COMPILE_OK) {
                    m_compound_statement.LogOutput();
                    state = 7;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 7: {
                if (name == R_CURLY_BRACKET_SYM) {
                    int space_length = 0;
                    symbol_table_tree->GetTableSpaceLength(m_identifier_name, space_length);
                    handle_func_table->InsertTerm(m_identifier_name, space_length, return_value_number, argument_type);
                    symbol_table_tree->UpgradeAddress();
                    string previous_table_name = symbol_table_tree->GetCurrentPreviousTableName();
                    symbol_table_tree->SetCurrentTableName(previous_table_name);
                    state = 8;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 8: return COMPILE_OK;
        }
        if (state != 4 && state != 7)
            handle_correct_queue->NextSymbol();
    }
}